

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gfxwrapper_opengl.c
# Opt level: O1

_Bool GlCheckExtension(char *extension)

{
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  code *pcVar3;
  char *pcVar4;
  int iVar5;
  bool bVar6;
  GLint i;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  pcVar3 = (code *)glXGetProcAddress("glGetStringi");
  glGetIntegerv(0x821d,&local_34);
  GlCheckErrors("glGetIntegerv(pname, &i)");
  GlCheckErrors("const GLint numExtensions = glGetInteger(GL_NUM_EXTENSIONS)");
  bVar6 = 0 < local_34;
  if (0 < local_34) {
    pcVar4 = (char *)(*pcVar3)(0x1f03,0);
    GlCheckErrors("const GLubyte *string = glGetStringi(GL_EXTENSIONS, i)");
    iVar1 = strcmp(pcVar4,extension);
    if (iVar1 != 0) {
      iVar1 = 1;
      do {
        iVar5 = iVar1;
        if (local_34 == iVar5) break;
        pcVar4 = (char *)(*pcVar3)(0x1f03,iVar5);
        GlCheckErrors("const GLubyte *string = glGetStringi(GL_EXTENSIONS, i)");
        iVar2 = strcmp(pcVar4,extension);
        iVar1 = iVar5 + 1;
      } while (iVar2 != 0);
      bVar6 = iVar5 < local_34;
    }
  }
  return bVar6;
}

Assistant:

static bool GlCheckExtension(const char *extension) {
#if defined(OS_WINDOWS) || defined(OS_LINUX)
    PFNGLGETSTRINGIPROC glGetStringi = (PFNGLGETSTRINGIPROC)GetExtension("glGetStringi");
#endif
    GL(const GLint numExtensions = glGetInteger(GL_NUM_EXTENSIONS));
    for (int i = 0; i < numExtensions; i++) {
        GL(const GLubyte *string = glGetStringi(GL_EXTENSIONS, i));
        if (strcmp((const char *)string, extension) == 0) {
            return true;
        }
    }
    return false;
}